

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O2

_Bool upb_DefPool_SetFeatureSetDefaults
                (upb_DefPool *s,char *serialized_defaults,size_t serialized_len,upb_Status *status)

{
  upb_Arena *a;
  upb_Message *msg;
  ulong *puVar1;
  _Bool _Var2;
  upb_DecodeStatus uVar3;
  google_protobuf_FeatureSetDefaults *msg_00;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  char *fmt;
  int iVar8;
  int32_t ret;
  int32_t default_val;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  ulong local_48;
  ulong local_40;
  upb_Status *local_38;
  
  a = s->arena;
  msg_00 = (google_protobuf_FeatureSetDefaults *)
           _upb_Message_New(&google__protobuf__FeatureSetDefaults_msg_init,a);
  if ((msg_00 == (google_protobuf_FeatureSetDefaults *)0x0) ||
     (uVar3 = upb_Decode(serialized_defaults,serialized_len,(upb_Message *)msg_00,
                         &google__protobuf__FeatureSetDefaults_msg_init,(upb_ExtensionRegistry *)0x0
                         ,0,a), uVar3 != kUpb_DecodeStatus_Ok)) {
    pcVar7 = "Failed to parse defaults";
LAB_002428c0:
    upb_Status_SetErrorFormat(status,pcVar7);
    return false;
  }
  if ((s->files).t.count != 0) {
    pcVar7 = "Feature set defaults can\'t be changed once the pool has started building";
    goto LAB_002428c0;
  }
  local_50 = 0;
  _Var2 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)&DAT_00371104,&local_50);
  if (_Var2) {
LAB_00242915:
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              ((upb_MiniTableField *)&DAT_00371104,&local_58,
               (void *)((long)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 + 4));
    iVar6 = (int)local_58;
  }
  else {
    _Var2 = upb_Message_HasBaseField((upb_Message *)msg_00,(upb_MiniTableField *)&DAT_00371104);
    iVar6 = 0;
    if (_Var2) goto LAB_00242915;
  }
  local_50 = 0;
  _Var2 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)&DAT_00371110,&local_50);
  if (_Var2) {
LAB_0024295f:
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              ((upb_MiniTableField *)&DAT_00371110,&local_58,msg_00 + 2);
    iVar8 = (int)local_58;
  }
  else {
    _Var2 = upb_Message_HasBaseField((upb_Message *)msg_00,(upb_MiniTableField *)&DAT_00371110);
    iVar8 = 0;
    if (_Var2) goto LAB_0024295f;
  }
  if (iVar8 < iVar6) {
    pcVar7 = upb_FileDef_EditionName(iVar6);
    pcVar4 = upb_FileDef_EditionName(iVar8);
    fmt = "Invalid edition range %s to %s";
    goto LAB_00242ab6;
  }
  local_58 = 0;
  _Var2 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)&DAT_0037111c,&local_58);
  local_38 = status;
  if ((_Var2) ||
     (_Var2 = upb_Message_HasBaseField((upb_Message *)msg_00,(upb_MiniTableField *)&DAT_0037111c),
     _Var2)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              ((upb_MiniTableField *)&DAT_0037111c,&local_50,msg_00 + 3);
    puVar1 = (ulong *)CONCAT44(uStack_4c,local_50);
    if (puVar1 == (ulong *)0x0) goto LAB_00242a16;
    local_40 = puVar1[1];
    local_48 = *puVar1 & 0xfffffffffffffff8;
  }
  else {
LAB_00242a16:
    local_40 = 0;
    local_48 = 0;
  }
  uVar5 = 0;
  iVar6 = 0;
  do {
    iVar8 = iVar6;
    if (local_40 == uVar5) {
      s->feature_set_defaults = msg_00;
      return true;
    }
    msg = *(upb_Message **)(local_48 + uVar5 * 8);
    local_50 = 0;
    _Var2 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                      ((upb_MiniTableField *)&DAT_00371128,&local_50);
    if ((!_Var2) &&
       (_Var2 = upb_Message_HasBaseField(msg,(upb_MiniTableField *)&DAT_00371128), !_Var2)) {
LAB_00242ac8:
      pcVar7 = "Invalid edition UNKNOWN specified";
      status = local_38;
      goto LAB_002428c0;
    }
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              ((upb_MiniTableField *)&DAT_00371128,&local_58,(void *)((long)&msg[1].field_0 + 4));
    iVar6 = (int)local_58;
    if ((int)local_58 == 0) goto LAB_00242ac8;
    uVar5 = uVar5 + 1;
  } while (iVar8 < (int)local_58);
  pcVar7 = upb_FileDef_EditionName(iVar8);
  pcVar4 = upb_FileDef_EditionName(iVar6);
  fmt = "Feature set defaults are not strictly increasing, %s is greater than or equal to %s";
  status = local_38;
LAB_00242ab6:
  upb_Status_SetErrorFormat(status,fmt,pcVar7,pcVar4);
  return false;
}

Assistant:

bool upb_DefPool_SetFeatureSetDefaults(upb_DefPool* s,
                                       const char* serialized_defaults,
                                       size_t serialized_len,
                                       upb_Status* status) {
  const UPB_DESC(FeatureSetDefaults)* defaults = UPB_DESC(
      FeatureSetDefaults_parse)(serialized_defaults, serialized_len, s->arena);
  if (!defaults) {
    upb_Status_SetErrorFormat(status, "Failed to parse defaults");
    return false;
  }
  if (upb_strtable_count(&s->files) > 0) {
    upb_Status_SetErrorFormat(status,
                              "Feature set defaults can't be changed once the "
                              "pool has started building");
    return false;
  }
  int min_edition = UPB_DESC(FeatureSetDefaults_minimum_edition(defaults));
  int max_edition = UPB_DESC(FeatureSetDefaults_maximum_edition(defaults));
  if (min_edition > max_edition) {
    upb_Status_SetErrorFormat(status, "Invalid edition range %s to %s",
                              upb_FileDef_EditionName(min_edition),
                              upb_FileDef_EditionName(max_edition));
    return false;
  }
  size_t size;
  const UPB_DESC(
      FeatureSetDefaults_FeatureSetEditionDefault)* const* default_list =
      UPB_DESC(FeatureSetDefaults_defaults(defaults, &size));
  int prev_edition = UPB_DESC(EDITION_UNKNOWN);
  for (size_t i = 0; i < size; ++i) {
    int edition = UPB_DESC(
        FeatureSetDefaults_FeatureSetEditionDefault_edition(default_list[i]));
    if (edition == UPB_DESC(EDITION_UNKNOWN)) {
      upb_Status_SetErrorFormat(status, "Invalid edition UNKNOWN specified");
      return false;
    }
    if (edition <= prev_edition) {
      upb_Status_SetErrorFormat(status,
                                "Feature set defaults are not strictly "
                                "increasing, %s is greater than or equal to %s",
                                upb_FileDef_EditionName(prev_edition),
                                upb_FileDef_EditionName(edition));
      return false;
    }
    prev_edition = edition;
  }

  // Copy the defaults into the pool.
  s->feature_set_defaults = defaults;
  return true;
}